

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O3

bool __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_true>::AtomEscapePass0
          (Parser<UTF8EncodingPolicyBase<false>,_true> *this)

{
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  CharCount n;
  undefined4 *puVar7;
  ArenaAllocator *pAVar8;
  byte *last;
  CharCount i;
  byte *pbVar9;
  long lVar10;
  ulong uVar11;
  OLECHAR local_42;
  EncodedChar **ppEStack_40;
  Char c;
  bool local_31 [8];
  bool surrogateEncountered;
  
  ppEStack_40 = &this->next;
  pbVar9 = this->next;
  if (this->inputLim < pbVar9) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar2) goto LAB_00ed6865;
    *puVar7 = 0;
    pbVar9 = *ppEStack_40;
  }
  bVar3 = *pbVar9;
  uVar11 = (ulong)bVar3;
  if ((uVar11 == 0) && (this->inputLim <= pbVar9)) {
    Fail(this,-0x7ff5ec67);
    return false;
  }
  if ((ASCIIChars::classes[uVar11] & 0x10) != 0) {
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      bVar3 = (byte)uVar11;
      if (this->inputLim < pbVar9 + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar2) goto LAB_00ed6865;
        *puVar7 = 0;
        pbVar9 = *ppEStack_40;
        bVar3 = *pbVar9;
      }
      if ((char)bVar3 < '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xd6,"(!this->IsMultiUnitChar(next[i]))",
                           "!this->IsMultiUnitChar(next[i])");
        if (!bVar2) goto LAB_00ed6865;
        *puVar7 = 0;
        pbVar9 = *ppEStack_40;
      }
      pbVar9 = pbVar9 + 1;
      this->next = pbVar9;
      if (this->inputLim < pbVar9) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar2) goto LAB_00ed6865;
        *puVar7 = 0;
        pbVar9 = *ppEStack_40;
      }
      uVar11 = (ulong)*pbVar9;
      if ((ASCIIChars::classes[uVar11] & 0x10) == 0) {
        return false;
      }
    } while( true );
  }
  if (this->inputLim < pbVar9) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar2) goto LAB_00ed6865;
    *puVar7 = 0;
    pbVar9 = *ppEStack_40;
    bVar3 = *pbVar9;
  }
  if (bVar3 == 99) {
    if (this->inputLim < pbVar9 + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar2) goto LAB_00ed6865;
      *puVar7 = 0;
      pbVar9 = *ppEStack_40;
    }
    if ((ASCIIChars::classes[pbVar9[1]] & 8) == 0) {
      DeferredFailIfUnicode(this,-0x7ff5e9d6);
      return false;
    }
    if (this->inputLim < pbVar9 + 2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar2) goto LAB_00ed6865;
      *puVar7 = 0;
    }
    else {
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    }
    lVar10 = 0;
    do {
      if ((char)(*ppEStack_40)[lVar10] < '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xd6,"(!this->IsMultiUnitChar(next[i]))",
                           "!this->IsMultiUnitChar(next[i])");
        if (!bVar2) goto LAB_00ed6865;
        *puVar7 = 0;
      }
      lVar10 = lVar10 + 1;
      if (lVar10 == 2) {
        *ppEStack_40 = *ppEStack_40 + 2;
        return false;
      }
    } while( true );
  }
  last = this->inputLim;
  if (last <= pbVar9) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x25d,"(!IsEOF())","!IsEOF()");
    if (!bVar2) goto LAB_00ed6865;
    *puVar7 = 0;
    last = this->inputLim;
  }
  local_42 = UTF8EncodingPolicyBase<false>::ReadFull<true>
                       (&this->super_UTF8EncodingPolicyBase<false>,ppEStack_40,last);
  if ((ushort)local_42 < 0x100) {
    if ((ASCIIChars::classes[(ushort)local_42] & 2) != 0) {
LAB_00ed649d:
      Fail(this,-0x7ff5fc0c);
    }
  }
  else if ((local_42 & 0xfffeU) == 0x2028) goto LAB_00ed649d;
  if ((ushort)local_42 < 0x75) {
    if (local_42 == L'B') {
      return true;
    }
    if (local_42 != L'b') {
      return false;
    }
    return true;
  }
  if (local_42 == L'u') {
    local_31[0] = false;
    n = TryParseExtendedUnicodeEscape(this,&local_42,local_31,true);
    if ((int)n < 1) {
      if (this->inputLim < this->next + 4) {
        return false;
      }
      bVar3 = ECLookahead(this,0);
      if ((ASCIIChars::classes[bVar3] & 0x40) == 0) {
        return false;
      }
      bVar3 = ECLookahead(this,1);
      if ((ASCIIChars::classes[bVar3] & 0x40) == 0) {
        return false;
      }
      bVar3 = ECLookahead(this,2);
      if ((ASCIIChars::classes[bVar3] & 0x40) == 0) {
        return false;
      }
      bVar3 = ECLookahead(this,3);
      if ((ASCIIChars::classes[bVar3] & 0x40) == 0) {
        return false;
      }
      n = 4;
      if (((this->scriptContext->config).threadConfig)->m_ES6Unicode == true) {
        bVar3 = ECLookahead(this,0);
        bVar3 = ASCIIChars::values[bVar3];
        bVar4 = ECLookahead(this,1);
        bVar4 = ASCIIChars::values[bVar4];
        bVar5 = ECLookahead(this,2);
        bVar5 = ASCIIChars::values[bVar5];
        bVar6 = ECLookahead(this,3);
        TrackIfSurrogatePair
                  (this,(uint)(byte)ASCIIChars::values[bVar6] | (uint)bVar5 << 4 |
                        (uint)bVar4 << 8 | (uint)bVar3 << 0xc,this->next + -1,5);
      }
    }
    else {
      if (local_31[0] != true) {
        return false;
      }
      pAVar8 = this->ctAllocator;
      if ((pAVar8 != (ArenaAllocator *)0x0) &&
         (this->currentSurrogatePairNode == (SurrogatePairTracker *)0x0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0x620,
                           "(this->ctAllocator == nullptr || this->currentSurrogatePairNode != nullptr)"
                           ,
                           "this->ctAllocator == nullptr || this->currentSurrogatePairNode != nullptr"
                          );
        if (!bVar2) goto LAB_00ed6865;
        *puVar7 = 0;
        pAVar8 = this->ctAllocator;
      }
      if ((pAVar8 != (ArenaAllocator *)0x0) && (pbVar9 != this->currentSurrogatePairNode->location))
      {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0x621,
                           "(this->ctAllocator == nullptr || current == this->currentSurrogatePairNode->location)"
                           ,
                           "this->ctAllocator == nullptr || current == this->currentSurrogatePairNode->location"
                          );
        if (!bVar2) goto LAB_00ed6865;
        *puVar7 = 0;
      }
    }
  }
  else {
    if (local_42 != L'x') {
      return false;
    }
    pbVar9 = this->next;
    if (this->inputLim < pbVar9 + 2) {
      return false;
    }
    if (this->inputLim < pbVar9) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar2) {
LAB_00ed6865:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar7 = 0;
      pbVar9 = *ppEStack_40;
    }
    if ((ASCIIChars::classes[*pbVar9] & 0x40) == 0) {
      return false;
    }
    bVar3 = ECLookahead(this,1);
    if ((ASCIIChars::classes[bVar3] & 0x40) == 0) {
      return false;
    }
    n = 2;
  }
  ECConsume(this,n);
  return false;
}

Assistant:

bool Parser<P, IsLiteral>::AtomEscapePass0()
    {
        EncodedChar ec = ECLookahead();
        if (ec == 0 && IsEOF())
        {
            // Terminating 0
            Fail(JSERR_RegExpSyntax);
            return false;
        }
        else if (standardEncodedChars->IsDigit(ec))
        {
            do
            {
                ECConsume();
            }
            while (standardEncodedChars->IsDigit(ECLookahead())); // terminating 0 is not a digit
            return false;
        }
        else if (ECLookahead() == 'c')
        {
            if (standardEncodedChars->IsLetter(ECLookahead(1))) // terminating 0 is not a letter
            {
                ECConsume(2);
            }
            else
            {
                DeferredFailIfUnicode(JSERR_RegExpInvalidEscape);
            }
            return false;
        }
        else
        {
            const EncodedChar *current = next;
            // An escaped '/' is ok
            Char c = NextChar();
            switch (c)
            {
            case 'b':
            case 'B':
                return true;
            // case 'c': handled as special case above
            case 'x':
                if (ECCanConsume(2) &&
                    standardEncodedChars->IsHex(ECLookahead(0)) &&
                    standardEncodedChars->IsHex(ECLookahead(1)))
                    ECConsume(2);
                break;
            case 'u':
                bool surrogateEncountered = false;
                int lengthOfSurrogate = TryParseExtendedUnicodeEscape(c, surrogateEncountered, true);
                if (lengthOfSurrogate > 0)
                {
                    if (surrogateEncountered)
                    {
                        // If we don't have an allocator, we don't create nodes
                        // Asserts in place as extra checks for when we do have an allocator
                        Assert(this->ctAllocator == nullptr || this->currentSurrogatePairNode != nullptr);
                        Assert(this->ctAllocator == nullptr || current == this->currentSurrogatePairNode->location);
                        ECConsume(lengthOfSurrogate);
                    }
                    //Don't fall through
                    break;
                }
                else if (ECCanConsume(4) &&
                    standardEncodedChars->IsHex(ECLookahead(0)) &&
                    standardEncodedChars->IsHex(ECLookahead(1)) &&
                    standardEncodedChars->IsHex(ECLookahead(2)) &&
                    standardEncodedChars->IsHex(ECLookahead(3)))
                {
                    if (this->scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())
                    {
                        codepoint_t value = (standardEncodedChars->DigitValue(ECLookahead(0)) << 12) |
                                            (standardEncodedChars->DigitValue(ECLookahead(1)) << 8) |
                                            (standardEncodedChars->DigitValue(ECLookahead(2)) << 4) |
                                            (standardEncodedChars->DigitValue(ECLookahead(3)));
                        TrackIfSurrogatePair(value, (next - 1), 5);
                    }
                    ECConsume(4);
                }
                break;
            }
            // embedded 0 is ok

            return false;
        }
    }